

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint
          (DebugDocument *this,StatementLocation statement,BREAKPOINT_STATE bps)

{
  code *pcVar1;
  anon_class_24_3_da7b94db map;
  bool bVar2;
  uint uVar3;
  UINT breakpointId;
  ScriptContext *this_00;
  undefined4 *puVar4;
  ThreadContext *pTVar5;
  DebugManager *pDVar6;
  PageAllocator *pageAllocator;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  BreakpointProbe *this_01;
  DebugContext *this_02;
  ProbeContainer *this_03;
  BreakpointProbeList *this_04;
  BreakpointProbeList *pBreakpointList_1;
  TrackAllocData local_118;
  BreakpointProbe *local_f0;
  BreakpointProbe *pProbe;
  StatementLocation *local_e0;
  ScriptContext *pSStack_d8;
  BreakpointProbeList *local_d0;
  BreakpointProbeList *local_b8;
  BreakpointProbeList *pDeleteList;
  ArenaAllocator arena;
  BreakpointProbeList *pBreakpointList;
  ScriptContext *scriptContext;
  BREAKPOINT_STATE bps_local;
  DebugDocument *this_local;
  
  this_00 = Utf8SourceInfo::GetScriptContext(this->utf8SourceInfo);
  if ((this_00 == (ScriptContext *)0x0) ||
     (uVar3 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(),
     (uVar3 & 1) != 0)) {
    return (BreakpointProbe *)0x0;
  }
  if (BREAKPOINT_DISABLED < bps) {
    if (bps == BREAKPOINT_ENABLED) {
      pAVar7 = &ScriptContext::AllocatorForDiagnostics(this_00)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_118,(type_info *)&BreakpointProbe::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                 ,0x85);
      pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar7,&local_118);
      this_01 = (BreakpointProbe *)
                new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar7,0x3f67b0);
      pTVar5 = ScriptContext::GetThreadContext(this_00);
      pDVar6 = ThreadContext::GetDebugManager(pTVar5);
      breakpointId = DebugManager::GetNextBreakpointId(pDVar6);
      BreakpointProbe::BreakpointProbe(this_01,this,&statement,breakpointId);
      local_f0 = this_01;
      this_02 = ScriptContext::GetDebugContext(this_00);
      this_03 = DebugContext::GetProbeContainer(this_02);
      Js::ProbeContainer::AddProbe(this_03,&local_f0->super_Probe);
      this_04 = GetBreakpointList(this);
      JsUtil::
      List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this_04,&local_f0);
      return local_f0;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                ,0x65,"(0)","Bad breakpoint state");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       GetBreakpointList(this);
  if ((BreakpointProbeList *)
      arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList !=
      (BreakpointProbeList *)0x0) {
    pTVar5 = ScriptContext::GetThreadContext(this_00);
    pDVar6 = ThreadContext::GetDebugManager(pTVar5);
    pageAllocator = DebugManager::GetDiagnosticPageAllocator(pDVar6);
    Memory::ArenaAllocator::ArenaAllocator
              ((ArenaAllocator *)&pDeleteList,L"TemporaryBreakpointList",pageAllocator,
               Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
    local_d0 = NewBreakpointList(this,(ArenaAllocator *)&pDeleteList);
    map.scriptContext = this_00;
    map.statement = &statement;
    map.pDeleteList = local_d0;
    local_e0 = &statement;
    pSStack_d8 = this_00;
    local_b8 = local_d0;
    JsUtil::
    List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    Map<Js::DebugDocument::SetBreakPoint(Js::StatementLocation,tagBREAKPOINT_STATE)::__0>
              ((List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList,map);
    pProbe = (BreakpointProbe *)
             arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList
    ;
    JsUtil::
    List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
    Map<Js::DebugDocument::SetBreakPoint(Js::StatementLocation,tagBREAKPOINT_STATE)::__1>
              ((List<Js::BreakpointProbe*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                *)local_b8,
               (anon_class_8_1_5bd2b29f)
               arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               freeList);
    JsUtil::
    List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Clear(local_b8);
    Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&pDeleteList);
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint(StatementLocation statement, BREAKPOINT_STATE bps)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        switch (bps)
        {
            default:
                AssertMsg(FALSE, "Bad breakpoint state");
                // Fall thru
            case BREAKPOINT_DISABLED:
            case BREAKPOINT_DELETED:
            {
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                if (pBreakpointList)
                {
                    ArenaAllocator arena(_u("TemporaryBreakpointList"), scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
                    BreakpointProbeList* pDeleteList = this->NewBreakpointList(&arena);

                    pBreakpointList->Map([&statement, scriptContext, pDeleteList](int index, BreakpointProbe * breakpointProbe)
                    {
                        if (breakpointProbe->Matches(statement.function, statement.statement.begin))
                        {
                            scriptContext->GetDebugContext()->GetProbeContainer()->RemoveProbe(breakpointProbe);
                            pDeleteList->Add(breakpointProbe);
                        }
                    });

                    pDeleteList->Map([pBreakpointList](int index, BreakpointProbe * breakpointProbe)
                    {
                        pBreakpointList->Remove(breakpointProbe);
                    });
                    pDeleteList->Clear();
                }

                break;
            }
            case BREAKPOINT_ENABLED:
            {
                BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement,
                    scriptContext->GetThreadContext()->GetDebugManager()->GetNextBreakpointId());

                scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                pBreakpointList->Add(pProbe);
                return pProbe;
                break;
            }
        }
        return nullptr;
    }